

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t dumpManifest(IDManifest *mfst)

{
  ulong uVar1;
  bool bVar2;
  IdLifetime IVar3;
  ulong uVar4;
  reference pbVar5;
  ostream *poVar6;
  string *psVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  size_type sVar9;
  reference pvVar10;
  unsigned_long *puVar11;
  unsigned_long uVar12;
  const_reference pvVar13;
  long lVar14;
  ulong in_RDI;
  string s_2;
  size_t i_2;
  string id;
  ConstIterator q_1;
  string s_1;
  size_t c_1;
  size_t i_1;
  size_t stringLen;
  ConstIterator q;
  size_t componentSize;
  size_t c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> componentLength;
  size_t maxNumLen;
  const_iterator s;
  bool first;
  ChannelGroupManifest *m;
  size_t i;
  size_t uncompressedSize;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc68;
  ConstIterator *in_stack_fffffffffffffc70;
  ConstIterator *in_stack_fffffffffffffc78;
  allocator_type *in_stack_fffffffffffffc80;
  ostream *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  unsigned_long in_stack_fffffffffffffca8;
  allocator_type local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  ulong local_1a0;
  allocator<char> local_191;
  string local_190 [32];
  string local_170 [32];
  undefined8 local_150;
  undefined8 local_148;
  allocator<char> local_139;
  string local_138 [32];
  string local_118 [32];
  ulong local_f8;
  allocator<char> local_e9;
  string local_e8 [32];
  unsigned_long local_c8;
  ulong local_c0;
  string local_b8 [32];
  unsigned_long local_98;
  undefined8 local_90;
  undefined8 local_88;
  unsigned_long local_80;
  ulong local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long local_40;
  _Self local_38;
  _Self local_30;
  byte local_21;
  ChannelGroupManifest *local_20;
  ulong local_18;
  size_t local_10;
  ulong local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  for (local_18 = 0; uVar1 = local_18, uVar4 = Imf_3_4::IDManifest::size(), uVar1 < uVar4;
      local_18 = local_18 + 1) {
    local_20 = (ChannelGroupManifest *)Imf_3_4::IDManifest::operator[](local_8);
    local_21 = 1;
    if (local_18 != 0) {
      std::operator<<((ostream *)&std::cout,"\n\n");
    }
    std::operator<<((ostream *)&std::cout," channels  : ");
    Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffc68);
    while( true ) {
      Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      local_38._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_fffffffffffffc68);
      bVar2 = std::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      if ((local_21 & 1) == 0) {
        std::operator<<((ostream *)&std::cout,',');
      }
      else {
        local_21 = 0;
      }
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc70);
      std::operator<<((ostream *)&std::cout,(string *)pbVar5);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x103571);
      lVar14 = std::__cxx11::string::size();
      local_10 = lVar14 + 1 + local_10;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffc70);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"\n hashScheme: ");
    psVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getHashScheme_abi_cxx11_(local_20);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout," encoding  : ");
    psVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getEncodingScheme_abi_cxx11_(local_20);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    IVar3 = Imf_3_4::IDManifest::ChannelGroupManifest::getLifetime(local_20);
    if (IVar3 == LIFETIME_FRAME) {
      std::operator<<((ostream *)&std::cout," lifetime  : frame\n");
    }
    else if (IVar3 == LIFETIME_SHOT) {
      std::operator<<((ostream *)&std::cout," lifetime  : shot\n");
    }
    else if (IVar3 == LIFETIME_STABLE) {
      std::operator<<((ostream *)&std::cout," lifetime  : stable\n");
    }
    local_40 = 0;
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(pvVar8);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1036f2);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc90,
               (size_type)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10371e);
    local_78 = 0;
    while( true ) {
      uVar1 = local_78;
      pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar8);
      if (sVar9 <= uVar1) break;
      pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar8,local_78);
      local_80 = std::__cxx11::string::size();
      local_10 = local_80 + 1 + local_10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_58,local_78);
      puVar11 = std::max<unsigned_long>(pvVar10,&local_80);
      uVar12 = *puVar11;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_58,local_78);
      *pvVar10 = uVar12;
      local_78 = local_78 + 1;
    }
    local_88 = Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    while( true ) {
      local_90 = Imf_3_4::IDManifest::ChannelGroupManifest::end();
      bVar2 = Imf_3_4::operator!=(in_stack_fffffffffffffc70,
                                  (ConstIterator *)in_stack_fffffffffffffc68);
      if (!bVar2) break;
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id((ConstIterator *)0x10390e);
      std::__cxx11::to_string(in_stack_fffffffffffffca8);
      uVar12 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_b8);
      local_10 = local_10 + uVar12;
      local_98 = uVar12;
      puVar11 = std::max<unsigned_long>(&local_40,&local_98);
      local_40 = *puVar11;
      local_c0 = 0;
      while( true ) {
        uVar1 = local_c0;
        pvVar8 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                           ((ConstIterator *)0x1039df);
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar8);
        if (sVar9 <= uVar1) break;
        pvVar8 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                           ((ConstIterator *)0x103a17);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar8,local_c0);
        lVar14 = std::__cxx11::string::size();
        local_10 = lVar14 + 1 + local_10;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_58,local_c0);
        pvVar8 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                           ((ConstIterator *)0x103a7d);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar8,local_c0);
        local_c8 = std::__cxx11::string::size();
        puVar11 = std::max<unsigned_long>(pvVar10,&local_c8);
        uVar12 = *puVar11;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_58,local_c0);
        *pvVar10 = uVar12;
        local_c0 = local_c0 + 1;
      }
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::operator++
                (in_stack_fffffffffffffc70);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"     ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
               (char)((ulong)in_stack_fffffffffffffc80 >> 0x38),
               (allocator<char> *)in_stack_fffffffffffffc78);
    std::operator<<(poVar6,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_f8 = 0;
    while( true ) {
      uVar1 = local_f8;
      pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar8);
      if (sVar9 <= uVar1) break;
      pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvVar8,local_f8);
      std::__cxx11::string::string(local_118,(string *)pvVar13);
      poVar6 = std::operator<<((ostream *)&std::cout,local_118);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_58,local_f8);
      std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
                 (char)((ulong)in_stack_fffffffffffffc80 >> 0x38),
                 (allocator<char> *)in_stack_fffffffffffffc78);
      std::operator<<(poVar6,local_138);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      std::__cxx11::string::~string(local_118);
      local_f8 = local_f8 + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_148 = Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    while( true ) {
      local_150 = Imf_3_4::IDManifest::ChannelGroupManifest::end();
      bVar2 = Imf_3_4::operator!=(in_stack_fffffffffffffc70,
                                  (ConstIterator *)in_stack_fffffffffffffc68);
      if (!bVar2) break;
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id((ConstIterator *)0x103e94);
      std::__cxx11::to_string(in_stack_fffffffffffffca8);
      poVar6 = std::operator<<((ostream *)&std::cout,"     ");
      poVar6 = std::operator<<(poVar6,local_170);
      in_stack_fffffffffffffca8 = local_40;
      std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
                 (char)((ulong)in_stack_fffffffffffffc80 >> 0x38),
                 (allocator<char> *)in_stack_fffffffffffffc78);
      std::operator<<(poVar6,local_190);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      local_1a0 = 0;
      while( true ) {
        uVar1 = local_1a0;
        pvVar8 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                           ((ConstIterator *)0x103f93);
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar8);
        if (sVar9 <= uVar1) break;
        in_stack_fffffffffffffc90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                       ((ConstIterator *)0x103fc2);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffc90,local_1a0);
        std::__cxx11::string::string(local_1c0,(string *)pvVar13);
        in_stack_fffffffffffffc88 = std::operator<<((ostream *)&std::cout,local_1c0);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_58,local_1a0);
        in_stack_fffffffffffffc70 = (ConstIterator *)*pvVar10;
        lVar14 = std::__cxx11::string::size();
        in_stack_fffffffffffffc78 = in_stack_fffffffffffffc70 + (1 - lVar14);
        in_stack_fffffffffffffc80 = &local_1e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
                   (char)((ulong)in_stack_fffffffffffffc80 >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffc78);
        std::operator<<(in_stack_fffffffffffffc88,local_1e0);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::~string(local_1c0);
        local_1a0 = local_1a0 + 1;
      }
      std::operator<<((ostream *)&std::cout,'\n');
      std::__cxx11::string::~string(local_170);
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::operator++
                (in_stack_fffffffffffffc70);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc80);
  }
  return local_10;
}

Assistant:

size_t
dumpManifest (const IDManifest& mfst)
{

    size_t uncompressedSize = 0;

    for (size_t i = 0; i < mfst.size (); ++i)
    {
        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        if (i > 0) { cout << "\n\n"; }
        cout << " channels  : ";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { cout << ','; }
            else { first = false; }

            cout << *s;
            uncompressedSize += s->size () + 1;
        }

        cout << "\n hashScheme: " << m.getHashScheme () << endl;
        cout << " encoding  : " << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME:
                cout << " lifetime  : frame\n";
                break;
            case IDManifest::LIFETIME_SHOT:
                cout << " lifetime  : shot\n";
                break;
            case IDManifest::LIFETIME_STABLE:
                cout << " lifetime  : stable\n";
                break;
        }

        //
        // compute max field sizes
        //
        size_t         maxNumLen = 0;
        vector<size_t> componentLength (m.getComponents ().size ());
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            size_t componentSize = m.getComponents ()[c].size ();
            uncompressedSize += componentSize + 1;
            componentLength[c] = max (componentLength[c], componentSize);
        }
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {

            size_t stringLen = to_string (q.id ()).size ();
            uncompressedSize += stringLen;
            maxNumLen = max (maxNumLen, stringLen);

            for (size_t i = 0; i < q.text ().size (); i++)
            {
                uncompressedSize += q.text ()[i].size () + 1;
                componentLength[i] =
                    max (componentLength[i], q.text ()[i].size ());
            }
        }

        cout << "     " << string (maxNumLen + 1, ' ');
        for (size_t c = 0; c < m.getComponents ().size (); ++c)
        {
            string s = m.getComponents ()[c];
            cout << s << string (componentLength[c] + 1 - s.size (), ' ');
        }
        cout << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            string id = to_string (q.id ());
            cout << "     " << id << string (maxNumLen + 1 - id.size (), ' ');
            for (size_t i = 0; i < q.text ().size (); i++)
            {
                string s = q.text ()[i];
                cout << s << string (componentLength[i] + 1 - s.size (), ' ');
            }
            cout << '\n';
        }
    }

    return uncompressedSize;
}